

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags,float row_min_height)

{
  ImGuiTable *pIVar1;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar2;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTable *in_stack_000000d0;
  ImGuiTable *in_stack_00000120;
  ImGuiContext *table_00;
  
  pIVar1 = GImGui->CurrentTable;
  table_00 = GImGui;
  if ((pIVar1->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(in_stack_00000120);
  }
  if ((pIVar1->IsInsideRow & 1U) != 0) {
    TableEndRow(in_stack_000000d0);
  }
  *(uint *)&pIVar1->field_0x90 =
       *(uint *)&pIVar1->field_0x90 & 0xffff |
       (int)(short)*(undefined4 *)&pIVar1->field_0x90 << 0x10;
  *(uint *)&pIVar1->field_0x90 = *(uint *)&pIVar1->field_0x90 & 0xffff0000 | in_EDI & 0xffff;
  pIVar1->RowMinHeight = in_XMM0_Da;
  TableBeginRow((ImGuiTable *)table_00);
  pIVar1->RowPosY2 = pIVar1->CellPaddingY + pIVar1->CellPaddingY + pIVar1->RowPosY2;
  fVar2 = ImMax<float>(pIVar1->RowPosY2,pIVar1->RowPosY1 + in_XMM0_Da);
  pIVar1->RowPosY2 = fVar2;
  pIVar1->InnerWindow->SkipItems = true;
  return;
}

Assistant:

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags, float row_min_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);
    if (table->IsInsideRow)
        TableEndRow(table);

    table->LastRowFlags = table->RowFlags;
    table->RowFlags = row_flags;
    table->RowMinHeight = row_min_height;
    TableBeginRow(table);

    // We honor min_row_height requested by user, but cannot guarantee per-row maximum height,
    // because that would essentially require a unique clipping rectangle per-cell.
    table->RowPosY2 += table->CellPaddingY * 2.0f;
    table->RowPosY2 = ImMax(table->RowPosY2, table->RowPosY1 + row_min_height);

    // Disable output until user calls TableNextColumn()
    table->InnerWindow->SkipItems = true;
}